

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

hugeint_t __thiscall
duckdb::WindowQuantileState<duckdb::hugeint_t>::WindowScalar<duckdb::hugeint_t,false>
          (WindowQuantileState<duckdb::hugeint_t> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_true> *dest_00;
  hugeint_t input;
  duckdb *this_00;
  uint64_t uVar1;
  bool bVar2;
  pointer this_01;
  pointer pHVar3;
  long lVar4;
  reference pvVar5;
  InternalException *this_02;
  InvalidInputException *pIVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong index;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  hugeint_t hVar11;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t result_1;
  array<duckdb::hugeint_t,_2UL> dest;
  string local_b8;
  hugeint_t local_98;
  duckdb *local_88;
  uint64_t uStack_80;
  hugeint_t local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_01 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    hVar11 = QuantileSortTree::WindowScalar<duckdb::hugeint_t,duckdb::hugeint_t,false>
                       (this_01,data,frames,n,result,q);
    return hVar11;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_*,_false>
      ._M_head_impl ==
      (HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
       *)0x0) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"No accelerator for scalar QUANTILE","");
    InternalException::InternalException(this_02,&local_b8);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pHVar3 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>,_true>
           ::operator->(&this->s);
  lVar4 = pHVar3->_count - 1;
  auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar10._0_8_ = lVar4;
  auVar10._12_4_ = 0x45300000;
  dStack_60 = auVar10._8_8_ - 1.9342813113834067e+25;
  local_68 = (dStack_60 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * q->dbl;
  local_58 = floor(local_68);
  local_48 = ceil(local_68);
  pHVar3 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>,_true>
           ::operator->(&this->s);
  index = (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f | (long)local_58;
  uVar8 = (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f | (long)local_48;
  dest_00 = &this->skips;
  duckdb_skiplistlib::skip_list::
  HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  ::at(pHVar3,index,(uVar8 - index) + 1,
       &dest_00->
        super_vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
      );
  pvVar5 = vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_true>::operator[](dest_00,0);
  local_88 = (duckdb *)(pvVar5->second).lower;
  uStack_80 = (pvVar5->second).upper;
  pvVar5 = vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_true>::operator[]
                     (dest_00,(ulong)(1 < (ulong)(((long)(this->skips).
                                                                                                                  
                                                  super_vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->skips).
                                                                                                                
                                                  super_vector<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_duckdb::hugeint_t>,_std::allocator<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                                 -0x5555555555555555)));
  uVar1 = uStack_80;
  this_00 = local_88;
  local_78.lower = (pvVar5->second).lower;
  local_78.upper = (pvVar5->second).upper;
  if (uVar8 == index) {
    input.upper = uStack_80;
    input.lower = (uint64_t)local_88;
    iVar7 = 0;
    bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input,&local_98,false);
    if (!bVar2) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.upper = iVar7;
      input_00.lower = uVar1;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_b8,this_00,input_00);
      InvalidInputException::InvalidInputException(pIVar6,&local_b8);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    hVar11.upper = uStack_80;
    hVar11.lower = (uint64_t)local_88;
    iVar7 = 0;
    bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar11,&local_98,false);
    if (!bVar2) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = iVar7;
      input_01.lower = uVar1;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_b8,this_00,input_01);
      InvalidInputException::InvalidInputException(pIVar6,&local_b8);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_b8._M_dataplus._M_p = (pointer)local_98.lower;
    local_b8._M_string_length = local_98.upper;
    local_98 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>(&local_78,result);
    auVar9._8_4_ = (int)(index >> 0x20);
    auVar9._0_8_ = index;
    auVar9._12_4_ = 0x45300000;
    local_98 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                         ((hugeint_t *)&local_b8,
                          local_68 -
                          ((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)index) - 4503599627370496.0)),&local_98)
    ;
  }
  return local_98;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}